

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_lash(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  OBJ_DATA *pOVar6;
  CHAR_DATA *victim;
  CClass *this;
  char *pcVar7;
  char arg [4608];
  char buf [4608];
  
  one_argument(argument,arg);
  iVar2 = get_skill(ch,(int)gsn_lash);
  if (iVar2 == 0) {
    pcVar7 = "You don\'t have the skill to lash people\'s legs.\n\r";
    goto LAB_00299a53;
  }
  pOVar6 = get_eq_char(ch,0x10);
  if ((pOVar6 == (OBJ_DATA *)0x0) || (uVar3 = pOVar6->value[0], (uVar3 & 0xfffffffe) != 6)) {
    pOVar6 = get_eq_char(ch,0x12);
    if (pOVar6 != (OBJ_DATA *)0x0) {
      iVar2 = iVar2 + -0xf;
      uVar3 = pOVar6->value[0];
      goto LAB_00299a19;
    }
  }
  else {
LAB_00299a19:
    if ((uVar3 & 0xfffffffe) == 6) {
      if (arg[0] == '\0') {
        victim = ch->fighting;
        if (victim == (CHAR_DATA *)0x0) {
          pcVar7 = "But you aren\'t fighting anyone!\n\r";
          goto LAB_00299a53;
        }
      }
      else {
        victim = get_char_room(ch,arg);
        if (victim == (CHAR_DATA *)0x0) {
          pcVar7 = "They aren\'t here.\n\r";
          goto LAB_00299a53;
        }
      }
      if (victim != ch) {
        bVar1 = is_safe_new(ch,victim,true);
        if (bVar1) {
          return;
        }
        bVar1 = is_affected_by(ch,0x12);
        if ((bVar1) && (ch->master == victim)) {
          act("But $N is your friend!",ch,(void *)0x0,victim,3);
          return;
        }
        if (((ch->off_flags[0] & 0x80) != 0) || (bVar1 = is_affected_by(ch,0x15), bVar1)) {
          iVar2 = iVar2 + 5;
        }
        if (((victim->off_flags[0] & 0x80) != 0) || (bVar1 = is_affected_by(victim,0x15), bVar1)) {
          iVar2 = iVar2 + -0x23;
        }
        iVar4 = get_curr_stat(ch,3);
        iVar5 = get_curr_stat(victim,3);
        iVar4 = iVar2 + iVar4 * 2 + iVar5 * -2;
        bVar1 = is_affected_by(victim,0x13);
        iVar2 = iVar4 + -0x1e;
        if (!bVar1) {
          iVar2 = iVar4;
        }
        bVar1 = is_npc(ch);
        iVar4 = iVar2;
        if (!bVar1) {
          this = char_data::Class(ch);
          iVar5 = CClass::GetIndex(this);
          iVar4 = iVar2 + -0x1e;
          if (iVar5 == 1) {
            iVar4 = iVar2;
          }
        }
        bVar1 = is_npc(victim);
        if (bVar1) {
          iVar4 = ((int)ch->level - (int)victim->level) * 3 + iVar4;
        }
        bVar1 = is_npc(ch);
        if (((!bVar1) && (bVar1 = is_npc(victim), !bVar1)) &&
           ((victim->fighting == (CHAR_DATA *)0x0 || (ch->fighting == (CHAR_DATA *)0x0)))) {
          pcVar7 = pers(ch,victim);
          sprintf(buf,"Help! %s is lashing me!",pcVar7);
          do_myell(victim,buf,ch);
        }
        iVar2 = number_percent();
        if (iVar4 < iVar2) {
          act("$n lashes at $N\'s legs but misses.",ch,(void *)0x0,victim,1);
          act("$n lashes at your legs but misses.",ch,(void *)0x0,victim,2);
          act("You lash at $N\'s legs but miss.",ch,(void *)0x0,victim,3);
          check_improve(ch,(int)gsn_lash,false,1);
          if (ch->fighting == (CHAR_DATA *)0x0) {
            set_fighting(ch,victim);
          }
          WAIT_STATE(ch,0x18);
          return;
        }
        act("$n lashes $N\'s legs, sending $M crashing down.",ch,(void *)0x0,victim,1);
        act("$n lashes your legs, sending you crashing to the ground.",ch,(void *)0x0,victim,2);
        act("You lash $N\'s legs, sending $M crashing to the ground.",ch,(void *)0x0,victim,3);
        check_improve(ch,(int)gsn_lash,true,1);
        LAG_CHAR(victim,0x12);
        WAIT_STATE(ch,0x18);
        iVar2 = dice(2,7);
        damage_new(ch,victim,iVar2,(int)gsn_lash,1,true,true,0,1,(char *)0x0);
        if (ch->fighting == (CHAR_DATA *)0x0) {
          multi_hit(victim,ch,-1);
        }
        victim->position = 5;
        return;
      }
      pcVar7 = "You try to lash your feet and look clumsy doing it.\n\r";
      goto LAB_00299a53;
    }
  }
  pcVar7 = "You aren\'t wielding any weapon to lash with.\n\r";
LAB_00299a53:
  send_to_char(pcVar7,ch);
  return;
}

Assistant:

void do_lash(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int chance;
	char buf[MAX_STRING_LENGTH];
	OBJ_DATA *weapon;

	one_argument(argument, arg);

	chance = get_skill(ch, gsn_lash);

	if (chance == 0)
	{
		send_to_char("You don't have the skill to lash people's legs.\n\r", ch);
		return;
	}

	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon == nullptr || (weapon->value[0] != WEAPON_WHIP && weapon->value[0] != WEAPON_FLAIL))
	{
		chance -= 15;
		weapon = get_eq_char(ch, WEAR_DUAL_WIELD);
	}

	if (weapon == nullptr || (weapon->value[0] != WEAPON_WHIP && weapon->value[0] != WEAPON_FLAIL))
	{
		send_to_char("You aren't wielding any weapon to lash with.\n\r", ch);
		return;
	}

	if (weapon->value[0] != WEAPON_WHIP && weapon->value[0] != WEAPON_FLAIL)
	{
		send_to_char("You need to be wielding a whip or flail to lash.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		victim = ch->fighting;

		if (victim == nullptr)
		{
			send_to_char("But you aren't fighting anyone!\n\r", ch);
			return;
		}
	}
	else
	{
		victim = get_char_room(ch, arg);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}
	}

	if (victim == ch)
	{
		send_to_char("You try to lash your feet and look clumsy doing it.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
	{
		act("But $N is your friend!", ch, nullptr, victim, TO_CHAR);
		return;
	}

	/* speed */
	if (IS_SET(ch->off_flags, OFF_FAST) || is_affected_by(ch, AFF_HASTE))
		chance += 5;

	if (IS_SET(victim->off_flags, OFF_FAST) || is_affected_by(victim, AFF_HASTE))
		chance -= 35;

	chance += get_curr_stat(ch, STAT_DEX) * 2;
	chance -= get_curr_stat(victim, STAT_DEX) * 2;

	if (is_affected_by(victim, AFF_FLYING))
		chance -= 30;

	if (!is_npc(ch) && ch->Class()->GetIndex() != CLASS_WARRIOR)
		chance -= 30;

	/* level */
	if (is_npc(victim))
		chance += (ch->level - victim->level) * 3;

	if (!is_npc(ch) && !is_npc(victim) && (victim->fighting == nullptr || ch->fighting == nullptr))
	{
		sprintf(buf, "Help! %s is lashing me!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	if (number_percent() > chance)
	{
		act("$n lashes at $N's legs but misses.", ch, 0, victim, TO_NOTVICT);
		act("$n lashes at your legs but misses.", ch, 0, victim, TO_VICT);
		act("You lash at $N's legs but miss.", ch, 0, victim, TO_CHAR);
		check_improve(ch, gsn_lash, false, 1);

		if (ch->fighting == nullptr)
			set_fighting(ch, victim);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return;
	}

	act("$n lashes $N's legs, sending $M crashing down.", ch, 0, victim, TO_NOTVICT);
	act("$n lashes your legs, sending you crashing to the ground.", ch, 0, victim, TO_VICT);
	act("You lash $N's legs, sending $M crashing to the ground.", ch, 0, victim, TO_CHAR);
	check_improve(ch, gsn_lash, true, 1);

	LAG_CHAR(victim, (int)(PULSE_VIOLENCE * 1.5));
	WAIT_STATE(ch, PULSE_VIOLENCE * 2);

	damage_old(ch, victim, dice(2, 7), gsn_lash, DAM_BASH, true);

	if (ch->fighting == nullptr)
		multi_hit(victim, ch, TYPE_UNDEFINED);

	victim->position = POS_RESTING;
}